

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

int __thiscall
re2::NFA::Step(NFA *this,Threadq *runq,Threadq *nextq,int c,StringPiece *context,char *p)

{
  char *pcVar1;
  Inst *this_00;
  int iVar2;
  Thread *t0;
  char **dst;
  char *pcVar3;
  bool bVar4;
  IndexValue *pIVar5;
  ostream *poVar6;
  IndexValue *pIVar7;
  uint uVar8;
  LogMessage local_1b0;
  
  nextq->size_ = 0;
  pIVar5 = (runq->dense_).ptr_._M_t.
           super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
           .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
           _M_head_impl;
  pcVar1 = p + -1;
  pIVar7 = pIVar5;
  do {
    if (pIVar7 == pIVar5 + runq->size_) goto LAB_001a605d;
    t0 = pIVar7->value_;
    if (t0 != (Thread *)0x0) {
      if (((this->longest_ != true) || (this->matched_ != true)) || (*t0->capture <= *this->match_))
      {
        this_00 = (this->prog_->inst_).ptr_._M_t.
                  super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                  .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + pIVar7->index_;
        uVar8 = this_00->out_opcode_ & 7;
        if (uVar8 == 1) {
          if ((pIVar7 == pIVar5) &&
             ((bVar4 = Prog::Inst::greedy(this_00,this->prog_), bVar4 || (this->longest_ == true))))
          {
            CopyCapture(this,this->match_,t0->capture);
            this->matched_ = true;
            iVar2 = (t0->field_0).ref;
            (t0->field_0).ref = iVar2 + -1;
            if (iVar2 < 2) {
              t0->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
              this->free_threads_ = t0;
            }
            while (pIVar7 + 1 !=
                   (runq->dense_).ptr_._M_t.
                   super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                   .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>
                   ._M_head_impl + runq->size_) {
              Decref(this,pIVar7[1].value_);
              pIVar7 = pIVar7 + 1;
            }
            runq->size_ = 0;
            bVar4 = Prog::Inst::greedy(this_00,this->prog_);
            if (bVar4) {
              uVar8 = (this_00->field_1).cap_;
            }
            else {
              uVar8 = this_00->out_opcode_ >> 4;
            }
            return uVar8;
          }
        }
        else if (uVar8 == 2) {
          AddToThreadq(this,nextq,this_00->out_opcode_ >> 4,c,context,p,t0);
        }
        else if (uVar8 == 5) {
          if ((p != (char *)0x0) && ((this->endmatch_ != true || (pcVar1 == this->etext_)))) {
            if (this->longest_ == false) {
              CopyCapture(this,this->match_,t0->capture);
              this->match_[1] = pcVar1;
              this->matched_ = true;
              iVar2 = (t0->field_0).ref;
              (t0->field_0).ref = iVar2 + -1;
              if (iVar2 < 2) {
                t0->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                this->free_threads_ = t0;
              }
              while (pIVar7 + 1 !=
                     (runq->dense_).ptr_._M_t.
                     super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                     .
                     super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>
                     ._M_head_impl + runq->size_) {
                Decref(this,pIVar7[1].value_);
                pIVar7 = pIVar7 + 1;
              }
LAB_001a605d:
              runq->size_ = 0;
              return 0;
            }
            dst = this->match_;
            if (((this->matched_ != true) || (pcVar3 = *t0->capture, pcVar3 < *dst)) ||
               ((pcVar3 == *dst && (dst[1] < pcVar1)))) {
              CopyCapture(this,dst,t0->capture);
              this->match_[1] = pcVar1;
              this->matched_ = true;
            }
          }
        }
        else {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
                     ,0x167);
          poVar6 = std::operator<<((ostream *)&local_1b0.str_,"Unhandled ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,this_00->out_opcode_ & 7);
          std::operator<<(poVar6," in step");
          LogMessage::~LogMessage(&local_1b0);
        }
      }
      iVar2 = (t0->field_0).ref;
      (t0->field_0).ref = iVar2 + -1;
      if (iVar2 < 2) {
        t0->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
        this->free_threads_ = t0;
      }
    }
    pIVar7 = pIVar7 + 1;
    pIVar5 = (runq->dense_).ptr_._M_t.
             super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
             .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
             _M_head_impl;
  } while( true );
}

Assistant:

int NFA::Step(Threadq* runq, Threadq* nextq, int c, const StringPiece& context,
              const char* p) {
  nextq->clear();

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
    Thread* t = i->value();
    if (t == NULL)
      continue;

    if (longest_) {
      // Can skip any threads started after our current best match.
      if (matched_ && match_[0] < t->capture[0]) {
        Decref(t);
        continue;
      }
    }

    int id = i->index();
    Prog::Inst* ip = prog_->inst(id);

    switch (ip->opcode()) {
      default:
        // Should only see the values handled below.
        LOG(DFATAL) << "Unhandled " << ip->opcode() << " in step";
        break;

      case kInstByteRange:
        AddToThreadq(nextq, ip->out(), c, context, p, t);
        break;

      case kInstAltMatch:
        if (i != runq->begin())
          break;
        // The match is ours if we want it.
        if (ip->greedy(prog_) || longest_) {
          CopyCapture(match_, t->capture);
          matched_ = true;

          Decref(t);
          for (++i; i != runq->end(); ++i)
            Decref(i->value());
          runq->clear();
          if (ip->greedy(prog_))
            return ip->out1();
          return ip->out();
        }
        break;

      case kInstMatch: {
        // Avoid invoking undefined behavior when p happens
        // to be null - and p-1 would be meaningless anyway.
        if (p == NULL)
          break;

        if (endmatch_ && p-1 != etext_)
          break;

        if (longest_) {
          // Leftmost-longest mode: save this match only if
          // it is either farther to the left or at the same
          // point but longer than an existing match.
          if (!matched_ || t->capture[0] < match_[0] ||
              (t->capture[0] == match_[0] && p-1 > match_[1])) {
            CopyCapture(match_, t->capture);
            match_[1] = p-1;
            matched_ = true;
          }
        } else {
          // Leftmost-biased mode: this match is by definition
          // better than what we've already found (see next line).
          CopyCapture(match_, t->capture);
          match_[1] = p-1;
          matched_ = true;

          // Cut off the threads that can only find matches
          // worse than the one we just found: don't run the
          // rest of the current Threadq.
          Decref(t);
          for (++i; i != runq->end(); ++i)
            Decref(i->value());
          runq->clear();
          return 0;
        }
        break;
      }
    }
    Decref(t);
  }
  runq->clear();
  return 0;
}